

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::lookupGeometries
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  Node *pNVar2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar3;
  GroupNode *this_00;
  mapped_type *pmVar4;
  key_type *in_RDX;
  Node *pNVar5;
  bool bVar6;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_78;
  Transformations local_60;
  
  pNVar2 = node[3].ptr;
  if (pNVar2 != (Node *)0x0) {
    pNVar1 = in_RDX->ptr;
    pNVar5 = (Node *)(node + 2);
    do {
      bVar6 = (Node *)(pNVar2->fileName).field_2._M_allocated_capacity < pNVar1;
      if (!bVar6) {
        pNVar5 = pNVar2;
      }
      pNVar2 = (Node *)(&(pNVar2->fileName)._M_dataplus)[bVar6]._M_p;
    } while (pNVar2 != (Node *)0x0);
    if ((pNVar5 != (Node *)(node + 2)) &&
       ((Node *)(pNVar5->fileName).field_2._M_allocated_capacity <= pNVar1)) goto LAB_0016158f;
  }
  local_78.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.time_range.lower = 0.0;
  local_60.time_range.upper = 1.0;
  local_60.quaternion = false;
  pAVar3 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(0x40,0x10);
  local_60.spaces.items = pAVar3;
  alignedFree((void *)0x0);
  local_60.spaces.size_alloced = 1;
  local_60.spaces.size_active = 1;
  *(undefined8 *)&(pAVar3->l).vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(pAVar3->l).vx.field_0 + 8) = 0;
  *(undefined8 *)&(pAVar3->l).vy.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(pAVar3->l).vy.field_0 + 8) = 0;
  *(undefined8 *)&(pAVar3->l).vz.field_0 = 0;
  *(undefined8 *)((long)&(pAVar3->l).vz.field_0 + 8) = 0x3f800000;
  *(undefined8 *)&(pAVar3->p).field_0 = 0;
  *(undefined8 *)((long)&(pAVar3->p).field_0 + 8) = 0x3f80000000000000;
  convertGeometries((SceneGraphFlattener *)node,&local_78,in_RDX,&local_60);
  alignedFree(local_60.spaces.items);
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,&local_78);
  pmVar4 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         *)(node + 1),in_RDX);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (pmVar4->ptr != (Node *)0x0) {
    (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar4->ptr = (Node *)this_00;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::~vector(&local_78);
LAB_0016158f:
  pmVar4 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         *)(node + 1),in_RDX);
  pNVar2 = pmVar4->ptr;
  (this->node).ptr = pNVar2;
  if (pNVar2 != (Node *)0x0) {
    (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> lookupGeometries(Ref<SceneGraph::Node> node)
    {
      if (object_mapping.find(node) == object_mapping.end())
      {
        std::vector<Ref<SceneGraph::Node>> geometries;
        convertGeometries(geometries,node,one);
        object_mapping[node] = new SceneGraph::GroupNode(geometries);
      }
      
      return object_mapping[node];
    }